

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

void __thiscall
QMimeGlobMatchResult::addMatch
          (QMimeGlobMatchResult *this,QString *mimeType,int weight,QString *pattern,
          qsizetype knownSuffixLength)

{
  QStringList *this_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  this_00 = &this->m_allMatchingMimeTypes;
  bVar2 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)this_00,mimeType,CaseSensitive);
  if (bVar2) {
    return;
  }
  if (weight < this->m_weight) {
    QList<QString>::emplaceBack<QString_const&>(this_00,mimeType);
    return;
  }
  if (weight <= this->m_weight) {
    lVar1 = (pattern->d).size;
    if (lVar1 < this->m_matchingPatternLength) {
      return;
    }
    if (lVar1 <= this->m_matchingPatternLength) {
      bVar2 = false;
      goto LAB_004449c7;
    }
  }
  QList<QString>::clear(&this->m_matchingMimeTypes);
  this->m_matchingPatternLength = (pattern->d).size;
  this->m_weight = weight;
  bVar2 = true;
LAB_004449c7:
  bVar3 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)this,mimeType,CaseSensitive);
  if (!bVar3) {
    QList<QString>::emplaceBack<QString_const&>(&this->m_matchingMimeTypes,mimeType);
    if (bVar2) {
      QList<QString>::emplaceFront<QString_const&>(this_00,mimeType);
    }
    else {
      QList<QString>::emplaceBack<QString_const&>(this_00,mimeType);
    }
    this->m_knownSuffixLength = knownSuffixLength;
  }
  return;
}

Assistant:

void QMimeGlobMatchResult::addMatch(const QString &mimeType, int weight, const QString &pattern,
                                    qsizetype knownSuffixLength)
{
    if (m_allMatchingMimeTypes.contains(mimeType))
        return;
    // Is this a lower-weight pattern than the last match? Skip this match then.
    if (weight < m_weight) {
        m_allMatchingMimeTypes.append(mimeType);
        return;
    }
    bool replace = weight > m_weight;
    if (!replace) {
        // Compare the length of the match
        if (pattern.size() < m_matchingPatternLength)
            return; // too short, ignore
        else if (pattern.size() > m_matchingPatternLength) {
            // longer: clear any previous match (like *.bz2, when pattern is *.tar.bz2)
            replace = true;
        }
    }
    if (replace) {
        m_matchingMimeTypes.clear();
        // remember the new "longer" length
        m_matchingPatternLength = pattern.size();
        m_weight = weight;
    }
    if (!m_matchingMimeTypes.contains(mimeType)) {
        m_matchingMimeTypes.append(mimeType);
        if (replace)
            m_allMatchingMimeTypes.prepend(mimeType); // highest-weight first
        else
            m_allMatchingMimeTypes.append(mimeType);
        m_knownSuffixLength = knownSuffixLength;
    }
}